

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,
          vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          *fs,int min_dimension,int max_dimension)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference_wrapper<directed_flag_complex_in_memory_computer::reorder_edges_t> __args_3;
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  *in_RSI;
  int *in_RDI;
  int i;
  int index;
  vector<std::thread,_std::allocator<std::thread>_> t;
  int number_of_threads;
  reorder_edges_t *in_stack_ffffffffffffff48;
  thread *this_00;
  undefined4 in_stack_ffffffffffffff60;
  int iVar4;
  undefined4 in_stack_ffffffffffffff64;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  int local_7c;
  int *__args_2;
  code *__args_1;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> **__args;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  undefined1 local_18 [8];
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  *local_10;
  
  local_10 = in_RSI;
  sVar3 = std::
          vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          ::size(in_RSI);
  iVar1 = (int)sVar3;
  sVar3 = (size_type)iVar1;
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc7;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x1bc16a);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (this_01,sVar3,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x1bc18d);
  for (iVar5 = 0; iVar5 < iVar1 + -1; iVar5 = iVar5 + 1) {
    __args_1 = worker_thread<directed_flag_complex_in_memory_computer::reorder_edges_t>;
    __args = (directed_flag_complex_in_memory_t<std::pair<int,_float>_> **)0x0;
    __args_2 = in_RDI;
    std::
    vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
    ::operator[](local_10,(long)iVar5);
    __args_3 = std::ref<directed_flag_complex_in_memory_computer::reorder_edges_t>
                         (in_stack_ffffffffffffff48);
    this_00 = (thread *)local_18;
    in_stack_ffffffffffffff48 = (reorder_edges_t *)(local_18 + 4);
    std::thread::
    thread<void(directed_flag_complex_in_memory_t<std::pair<int,float>>::*)(int,int,directed_flag_complex_in_memory_computer::reorder_edges_t&,int,int),directed_flag_complex_in_memory_t<std::pair<int,float>>*,int&,int&,std::reference_wrapper<directed_flag_complex_in_memory_computer::reorder_edges_t>,int&,int&,void>
              ((thread *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),
               (type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),__args,
               (int *)__args_1,__args_2,
               (reference_wrapper<directed_flag_complex_in_memory_computer::reorder_edges_t> *)
               __args_3._M_data,(int *)in_stack_ffffffffffffffc0,(int *)in_stack_ffffffffffffffc8);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc8,
               (long)iVar5);
    std::thread::operator=(this_00,(thread *)in_stack_ffffffffffffff48);
    std::thread::~thread((thread *)0x1bc254);
  }
  iVar2 = iVar1 + -1;
  iVar4 = iVar1;
  std::
  vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
  ::operator[](local_10,(long)iVar2);
  worker_thread<directed_flag_complex_in_memory_computer::reorder_edges_t>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             (reorder_edges_t *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),in_stack_ffffffffffffffac,
             in_stack_ffffffffffffffa8);
  for (local_7c = 0; local_7c < iVar1 + -1; local_7c = local_7c + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)&stack0xffffffffffffffc8,
               (long)local_7c);
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)CONCAT44(iVar2,iVar4));
  return;
}

Assistant:

void for_each_cell(std::vector<Func>& fs, int min_dimension, int max_dimension = -1) {
		if (max_dimension == -1) max_dimension = min_dimension;

		auto number_of_threads = int(fs.size());
		std::vector<std::thread> t(number_of_threads);

		for (auto index = 0; index < number_of_threads - 1; ++index)
			t[index] = std::thread(&directed_flag_complex_in_memory_t<ExtraData>::worker_thread<Func>, this,
			                       number_of_threads, index, std::ref(fs[index]), min_dimension, max_dimension);

		// Also do work in this thread, namely the last bit
		worker_thread(number_of_threads, number_of_threads - 1, fs[number_of_threads - 1], min_dimension,
		              max_dimension);

		// Wait until all threads stopped
		for (auto i = 0; i < number_of_threads - 1; ++i) t[i].join();
	}